

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::~IsoWriter(IsoWriter *this)

{
  FileEntryInfo *pFVar1;
  int in_ESI;
  
  close(this,in_ESI);
  pFVar1 = this->m_rootDirInfo;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
  }
  operator_delete(pFVar1,0xa8);
  pFVar1 = this->m_systemStreamDir;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
  }
  operator_delete(pFVar1,0xa8);
  std::
  _Rb_tree<int,_std::pair<const_int,_MappingEntry>,_std::_Select1st<std::pair<const_int,_MappingEntry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
  ::~_Rb_tree(&(this->m_mappingEntries)._M_t);
  File::~File(&this->m_file);
  std::__cxx11::string::~string((string *)&this->m_appId);
  std::__cxx11::string::~string((string *)&this->m_impId);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

IsoWriter::~IsoWriter()
{
    close();
    delete m_rootDirInfo;
    delete m_systemStreamDir;
}